

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizerDiscardTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::RasterizerDiscardCase::iterate(RasterizerDiscardCase *this)

{
  Random *rnd;
  ostringstream *poVar1;
  TextureFormat TVar2;
  RenderContext *context;
  byte bVar3;
  GLenum GVar4;
  RenderTarget *pRVar5;
  ulong uVar6;
  RenderTarget *pRVar7;
  TestLog *pTVar8;
  size_t in_RCX;
  Surface *surface;
  void *__buf;
  undefined1 *value;
  void *__buf_00;
  IterateResult IVar9;
  uint uVar10;
  GLsizei count;
  int iVar11;
  char *pcVar12;
  GLbitfield mask;
  int iVar13;
  deUint32 mode;
  int iVar14;
  ulong uVar15;
  int iVar16;
  bool bVar17;
  float fVar18;
  allocator<char> local_25d;
  GLint local_25c;
  vector<float,_std::allocator<float>_> vertices;
  int local_234;
  Surface pixels;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string header;
  undefined1 local_1b0 [384];
  
  TVar2 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_25c = glwGetUniformLocation((this->m_program->m_program).m_program,"u_color");
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_234 = this->m_iterNdx + 1;
  de::toString<int>(&local_210,&local_234);
  std::operator+(&local_1f0,"Case iteration ",&local_210);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 &local_1f0," / ");
  de::toString<int>((string *)&pixels,&NUM_CASE_ITERATIONS);
  std::operator+(&header,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixels);
  std::__cxx11::string::~string((string *)&pixels);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  tcu::LogSection::LogSection((LogSection *)local_1b0,&header,&header);
  tcu::LogSection::write((LogSection *)local_1b0,TVar2.order,__buf,in_RCX);
  tcu::LogSection::~LogSection((LogSection *)local_1b0);
  uVar10 = this->m_caseOptions;
  if ((uVar10 & 1) != 0) {
    setupFramebufferObject(this);
    uVar10 = this->m_caseOptions;
  }
  if ((uVar10 & 2) != 0) {
    glwEnable(0xc11);
    glwScissor(0,0,pRVar5->m_width,pRVar5->m_height);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = TVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Scissor test enabled: glScissor(0, 0, ");
    std::ostream::operator<<(poVar1,pRVar5->m_width);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,pRVar5->m_height);
    std::operator<<((ostream *)poVar1,")");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  glwUseProgram((this->m_program->m_program).m_program);
  glwEnable(0xb71);
  glwDepthRangef(0.0,1.0);
  glwDepthFunc(0x203);
  glwEnable(0xb90);
  glwStencilFunc(0x205,1,0xff);
  glwStencilOp(0x1e01,0x1e00,0x1e00);
  glwClearColor(0.0,0.0,0.5,1.0);
  glwClearDepthf(1.0);
  glwClearStencil(0);
  glwClear(0x4500);
  glwEnableVertexAttribArray(0);
  if (this->m_drawMode < 7) {
    uVar10 = this->m_numPrimitives;
    switch(this->m_drawMode) {
    case 0:
      break;
    case 1:
      uVar10 = uVar10 * 2;
      break;
    default:
      uVar10 = uVar10 + 2;
      break;
    case 3:
      uVar10 = uVar10 + 1;
      break;
    case 4:
      uVar10 = uVar10 * 3;
    }
  }
  else {
    uVar10 = 0;
  }
  std::vector<float,_std::allocator<float>_>::resize(&vertices,(long)(int)(uVar10 * 4));
  mode = 5;
  rnd = &this->m_rnd;
  uVar15 = 0;
  uVar6 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar6 = uVar15;
  }
  for (; uVar6 * 4 != uVar15; uVar15 = uVar15 + 4) {
    fVar18 = deRandom_getFloat(&rnd->m_rnd);
    iVar14 = (int)uVar15;
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar14] = fVar18 + fVar18 + -1.0;
    fVar18 = deRandom_getFloat(&rnd->m_rnd);
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar14 + 1] = fVar18 + fVar18 + -1.0;
    fVar18 = deRandom_getFloat(&rnd->m_rnd);
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar14 + 2] = fVar18 * 0.79999995 + 0.1;
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar14 + 3] = 1.0;
  }
  glwVertexAttribPointer
            (0,4,0x1406,'\0',0,
             vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (this->m_caseType - CASE_CLEAR_DEPTH < 2) {
    glwClearColor(0.0,0.0,0.0,1.0);
    glwClear(0x4000);
  }
  glwUniform4f(local_25c,1.0,0.0,0.0,1.0);
  glwClearColor(1.0,0.0,0.0,1.0);
  glwClearDepthf(0.0);
  glwClearStencil(1);
  glwEnable(0x8c89);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"Rasterizer discard enabled",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fRasterizerDiscardTests.cpp"
                  ,0x148);
  switch(this->m_caseType) {
  case CASE_WRITE_DEPTH:
  case CASE_WRITE_STENCIL:
    uVar6 = (ulong)((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2;
    glwDrawArrays(this->m_drawMode,0,
                  (GLsizei)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                           4));
    break;
  case CASE_CLEAR_COLOR:
    mask = 0x4000;
    if ((this->m_caseOptions & 1) == 0) goto LAB_0105d7d0;
    value = FAIL_COLOR_RED;
    GVar4 = 0x1800;
LAB_0105d7e3:
    glwClearBufferfv(GVar4,0,(GLfloat *)value);
    break;
  case CASE_CLEAR_DEPTH:
    mask = 0x100;
    if ((this->m_caseOptions & 1) != 0) {
      value = (undefined1 *)&FAIL_DEPTH;
      GVar4 = 0x1801;
      goto LAB_0105d7e3;
    }
LAB_0105d7d0:
    glwClear(mask);
    break;
  case CASE_CLEAR_STENCIL:
    mask = 0x400;
    if ((this->m_caseOptions & 1) == 0) goto LAB_0105d7d0;
    glwClearBufferiv(0x1802,0,&FAIL_STENCIL);
  }
  glwDisable(0x8c89);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"Rasterizer discard disabled",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fRasterizerDiscardTests.cpp"
                  ,0x159);
  if (this->m_caseType - CASE_CLEAR_DEPTH < 2) {
    glwUniform4f(local_25c,0.0,0.0,0.5,1.0);
    mode = this->m_drawMode;
    uVar6 = (ulong)((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2;
    count = (GLsizei)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / 4);
  }
  else {
    if ((this->m_caseType != CASE_WRITE_STENCIL) ||
       (((this->m_caseOptions & 1) == 0 &&
        (pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context),
        pRVar7->m_stencilBits < 1)))) goto LAB_0105d8b2;
    count = 4;
    glwVertexAttribPointer(0,4,0x1406,'\0',0,UNIT_SQUARE);
    glwStencilFunc(0x202,1,0xff);
  }
  glwDrawArrays(mode,0,count);
LAB_0105d8b2:
  glwFinish();
  glwDisable(0xb90);
  glwDisable(0xb71);
  glwDisable(0xc11);
  tcu::Surface::Surface(&pixels,pRVar5->m_width,pRVar5->m_height);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&pixels);
  iVar14 = 0;
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  uVar6 = 0;
  if (0 < pixels.m_width) {
    uVar6 = (ulong)(uint)pixels.m_width;
  }
  iVar11 = 0;
  if (0 < pixels.m_height) {
    iVar11 = pixels.m_height;
  }
  bVar3 = 0;
  for (iVar16 = 0; uVar15 = uVar6, iVar13 = iVar14, iVar16 != iVar11; iVar16 = iVar16 + 1) {
    while (bVar17 = uVar15 != 0, uVar15 = uVar15 - 1, bVar17) {
      uVar10 = *(uint *)((long)pixels.m_pixels.m_ptr + (long)iVar13 * 4);
      bVar3 = bVar3 | (uVar10 & 0xff0000) != 0;
      iVar13 = iVar13 + 1;
      if ((char)uVar10 != '\0') goto LAB_0105d977;
    }
    iVar14 = iVar14 + pixels.m_width;
  }
LAB_0105d977:
  if ((this->m_caseOptions & 1) != 0) {
    deleteFramebufferObject(this);
  }
  bVar17 = (bool)(bVar3 & pixels.m_height <= iVar16);
  if (!bVar17) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"Result image",(allocator<char> *)&local_234);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"Result image",&local_25d);
    surface = &pixels;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_1f0,&local_210,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,TVar2.order,__buf_00,(size_t)surface);
    tcu::LogImage::~LogImage((LogImage *)local_1b0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Test result: ");
  pcVar12 = "Failed!";
  if (bVar17) {
    pcVar12 = "Passed!";
  }
  std::operator<<((ostream *)poVar1,pcVar12);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  if (bVar17) {
    local_1b0._0_8_ = TVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Primitive or buffer clear was discarded correctly.");
    pTVar8 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::TestLog::endSection(pTVar8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    uVar10 = this->m_iterNdx;
    this->m_iterNdx = uVar10 + 1;
    IVar9 = (IterateResult)(0x7ffffffe < uVar10);
  }
  else {
    local_1b0._0_8_ = TVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Primitive or buffer clear was not discarded.");
    pTVar8 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::TestLog::endSection(pTVar8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    IVar9 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  tcu::Surface::~Surface(&pixels);
  std::__cxx11::string::~string((string *)&header);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&vertices.super__Vector_base<float,_std::allocator<float>_>);
  return IVar9;
}

Assistant:

RasterizerDiscardCase::IterateResult RasterizerDiscardCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	deUint32					colorUnif		= glGetUniformLocation(m_program->getProgram(), "u_color");
	bool						failColorFound	= false;
	bool						passColorFound	= false;
	std::vector<float>			vertices;

	std::string header = "Case iteration " + de::toString(m_iterNdx+1) + " / " + de::toString(NUM_CASE_ITERATIONS);
	log << TestLog::Section(header, header);

	DE_ASSERT (m_program);

	// Create and bind FBO if needed

	if (m_caseOptions & CASEOPTION_FBO)
	{
		try
		{
			setupFramebufferObject();
		}
		catch (tcu::NotSupportedError& e)
		{
			log << TestLog::Message << "ERROR: " << e.what() << "." << TestLog::EndMessage << TestLog::EndSection;
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
			return STOP;
		}
		catch (tcu::InternalError& e)
		{
			log << TestLog::Message << "ERROR: " << e.what() << "." << TestLog::EndMessage << TestLog::EndSection;
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
			return STOP;
		}
	}

	if (m_caseOptions & CASEOPTION_SCISSOR)
	{
		glEnable (GL_SCISSOR_TEST);
		glScissor(0, 0, renderTarget.getWidth(), renderTarget.getHeight());
		log << TestLog::Message << "Scissor test enabled: glScissor(0, 0, " << renderTarget.getWidth() << ", " << renderTarget.getHeight() << ")" << TestLog::EndMessage;
	}

	glUseProgram	(m_program->getProgram());

	glEnable		(GL_DEPTH_TEST);
	glDepthRangef	(0.0f, 1.0f);
	glDepthFunc		(GL_LEQUAL);

	glEnable		(GL_STENCIL_TEST);
	glStencilFunc	(GL_NOTEQUAL, 1, 0xFF);
	glStencilOp		(GL_REPLACE, GL_KEEP, GL_KEEP);

	glClearColor	(PASS_COLOR_BLUE.x(), PASS_COLOR_BLUE.y(), PASS_COLOR_BLUE.z(), PASS_COLOR_BLUE.w());
	glClearDepthf	(1.0f);
	glClearStencil	(0);
	glClear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

	// Generate vertices

	glEnableVertexAttribArray (0);
	generateVertices		  (vertices, m_numPrimitives, m_rnd, m_drawMode);
	glVertexAttribPointer	  (0, 4, GL_FLOAT, GL_FALSE, 0, &vertices[0]);

	// Clear color to black for depth and stencil clear cases

	if (m_caseType == CASE_CLEAR_DEPTH || m_caseType == CASE_CLEAR_STENCIL)
	{
		glClearColor	(BLACK_COLOR.x(), BLACK_COLOR.y(), BLACK_COLOR.z(), BLACK_COLOR.w());
		glClear			(GL_COLOR_BUFFER_BIT);
	}

	// Set fail values for color, depth and stencil

	glUniform4f		(colorUnif, FAIL_COLOR_RED.x(), FAIL_COLOR_RED.y(), FAIL_COLOR_RED.z(), FAIL_COLOR_RED.w());
	glClearColor	(FAIL_COLOR_RED.x(), FAIL_COLOR_RED.y(), FAIL_COLOR_RED.z(), FAIL_COLOR_RED.w());
	glClearDepthf	(FAIL_DEPTH);
	glClearStencil	(FAIL_STENCIL);

	// Enable rasterizer discard

	glEnable		(GL_RASTERIZER_DISCARD);
	GLU_CHECK_MSG	("Rasterizer discard enabled");

	// Do to-be-discarded primitive draws and buffer clears

	switch (m_caseType)
	{
		case CASE_WRITE_DEPTH:			glDrawArrays(m_drawMode, 0, (int)vertices.size() / 4);																	break;
		case CASE_WRITE_STENCIL:		glDrawArrays(m_drawMode, 0, (int)vertices.size() / 4);																	break;
		case CASE_CLEAR_COLOR:			(m_caseOptions & CASEOPTION_FBO) ? glClearBufferfv(GL_COLOR, 0, &FAIL_COLOR_RED[0])	: glClear(GL_COLOR_BUFFER_BIT);		break;
		case CASE_CLEAR_DEPTH:			(m_caseOptions & CASEOPTION_FBO) ? glClearBufferfv(GL_DEPTH, 0, &FAIL_DEPTH)		: glClear(GL_DEPTH_BUFFER_BIT);		break;
		case CASE_CLEAR_STENCIL:		(m_caseOptions & CASEOPTION_FBO) ? glClearBufferiv(GL_STENCIL, 0, &FAIL_STENCIL)	: glClear(GL_STENCIL_BUFFER_BIT);	break;
		default:						DE_ASSERT(false);
	}

	// Disable rasterizer discard

	glDisable		(GL_RASTERIZER_DISCARD);
	GLU_CHECK_MSG	("Rasterizer discard disabled");

	if (m_caseType == CASE_WRITE_STENCIL)
	{
		if ((m_caseOptions & CASEOPTION_FBO) || m_context.getRenderTarget().getStencilBits() > 0)
		{
			// Draw a full-screen square that colors all pixels red if they have stencil value 1.

			glVertexAttribPointer (0, 4, GL_FLOAT, GL_FALSE, 0, &UNIT_SQUARE[0]);
			glStencilFunc		  (GL_EQUAL, 1, 0xFF);
			glDrawArrays		  (GL_TRIANGLE_STRIP, 0, 4);
		}
		// \note If no stencil buffers are present and test is rendering to default framebuffer, test will always pass.
	}
	else if (m_caseType == CASE_CLEAR_DEPTH || m_caseType == CASE_CLEAR_STENCIL)
	{
		// Draw pass-indicating primitives for depth and stencil clear cases

		glUniform4f	 (colorUnif, PASS_COLOR_BLUE.x(), PASS_COLOR_BLUE.y(), PASS_COLOR_BLUE.z(), PASS_COLOR_BLUE.w());
		glDrawArrays (m_drawMode, 0, (int)vertices.size() / 4);
	}

	glFinish  ();
	glDisable (GL_STENCIL_TEST);
	glDisable (GL_DEPTH_TEST);
	glDisable (GL_SCISSOR_TEST);

	// Read and check pixel data

	tcu::Surface pixels(renderTarget.getWidth(), renderTarget.getHeight());
	glu::readPixels(m_context.getRenderContext(), 0, 0, pixels.getAccess());

	{
		int width = pixels.getWidth();
		int height = pixels.getHeight();

		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				if (pixels.getPixel(x,y).getBlue() != 0)
					passColorFound = true;

				if (pixels.getPixel(x,y).getRed() != 0)
				{
					failColorFound = true;
					break;
				}
			}
			if (failColorFound) break;
		}
	}

	// Delete FBO if created

	if (m_caseOptions & CASEOPTION_FBO)
		deleteFramebufferObject();

	// Evaluate test result

	bool testOk = passColorFound && !failColorFound;

	if (!testOk)
		log << TestLog::Image ("Result image", "Result image", pixels);
	log << TestLog::Message << "Test result: " << (testOk ? "Passed!" : "Failed!") << TestLog::EndMessage;

	if (!testOk)
	{
		log << TestLog::Message << "Primitive or buffer clear was not discarded." << TestLog::EndMessage << TestLog::EndSection;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	log << TestLog::Message << "Primitive or buffer clear was discarded correctly." << TestLog::EndMessage << TestLog::EndSection;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}